

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall Scene::setCamera(Scene *this,Vector *org,Vector *dir,Vector *up)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 local_58 [16];
  double local_48;
  undefined1 local_38 [16];
  double local_28;
  
  dVar3 = org->y;
  (this->eye).x = org->x;
  (this->eye).y = dVar3;
  (this->eye).z = org->z;
  dVar3 = dir->y;
  (this->eye_dir).x = dir->x;
  (this->eye_dir).y = dVar3;
  (this->eye_dir).z = dir->z;
  operator^(up,dir);
  dVar3 = SQRT(local_28 * local_28 +
               local_38._0_8_ * local_38._0_8_ + local_38._8_8_ * local_38._8_8_);
  auVar2._8_8_ = dVar3;
  auVar2._0_8_ = dVar3;
  auVar2 = divpd(local_38,auVar2);
  (this->view_x).x = (double)auVar2._0_8_;
  (this->view_x).y = (double)auVar2._8_8_;
  (this->view_x).z = local_28 / dVar3;
  operator^(dir,&this->view_x);
  dVar3 = SQRT(local_48 * local_48 +
               local_58._0_8_ * local_58._0_8_ + local_58._8_8_ * local_58._8_8_);
  auVar1._8_8_ = dVar3;
  auVar1._0_8_ = dVar3;
  auVar2 = divpd(local_58,auVar1);
  (this->view_y).x = (double)auVar2._0_8_;
  (this->view_y).y = (double)auVar2._8_8_;
  (this->view_y).z = local_48 / dVar3;
  return;
}

Assistant:

void Scene::setCamera(const Vector &org, const Vector &dir, const Vector &up)
{
   eye     = org;                  // eye point
   eye_dir = dir;                  // viewing direction
   view_x  = normalize(up ^ dir);  // basis vectors
   view_y  = normalize(dir ^ view_x);
}